

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall kj::Vector<bool>::setCapacity(Vector<bool> *this,size_t newSize)

{
  bool *pbVar1;
  ArrayBuilder<bool> newBuilder;
  ArrayBuilder<bool> local_30;
  
  pbVar1 = (this->builder).ptr;
  if (newSize < (ulong)((long)(this->builder).pos - (long)pbVar1)) {
    (this->builder).pos = pbVar1 + newSize;
  }
  local_30.ptr = kj::_::HeapArrayDisposer::allocateUninitialized<bool>(newSize);
  local_30.endPtr = local_30.ptr + newSize;
  local_30.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_30.pos = local_30.ptr;
  ArrayBuilder<bool>::addAll<kj::ArrayBuilder<bool>>(&local_30,&this->builder);
  ArrayBuilder<bool>::operator=(&this->builder,&local_30);
  ArrayBuilder<bool>::dispose(&local_30);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }